

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * ODDLParser::OpenDDLParser::parseProperty(char *in,char *end,Property **prop)

{
  pointer names_00;
  pointer ppNVar1;
  byte bVar2;
  byte *pbVar3;
  char *pcVar4;
  Reference *this;
  Property *this_00;
  bool bVar5;
  ulong uVar6;
  byte *pbVar7;
  Text *pTVar8;
  char *tmp;
  byte *pbVar9;
  Text *id;
  Value *primData;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Text *local_58;
  Value *local_50;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> local_48;
  
  *prop = (Property *)0x0;
  if (in == end || in == (char *)0x0) {
    return in;
  }
  do {
    pbVar3 = (byte *)in;
    if ((0x2c < (ulong)(byte)*in) || ((0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0))
    break;
    in = (char *)((byte *)in + 1);
    pbVar3 = (byte *)end;
  } while (in != end);
  local_58 = (Text *)0x0;
  pbVar3 = (byte *)parseIdentifier((char *)pbVar3,end,&local_58);
  pTVar8 = local_58;
  pbVar9 = pbVar3;
  if (local_58 == (Text *)0x0) {
    return (char *)pbVar3;
  }
  for (; pbVar3 != (byte *)end; pbVar3 = pbVar3 + 1) {
    bVar2 = *pbVar3;
    pbVar9 = pbVar3;
    if ((0x2c < (ulong)bVar2) || ((0x100100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
    goto LAB_0066e4ca;
    pbVar9 = (byte *)end;
  }
  bVar2 = *pbVar9;
LAB_0066e4ca:
  if (bVar2 != 0x3d) {
    Text::~Text(local_58);
    uVar6 = 0x18;
    goto LAB_0066e56b;
  }
  pbVar9 = pbVar9 + 1;
  pbVar3 = pbVar9;
  pbVar7 = pbVar9;
  while (((pbVar3 != (byte *)end && (pbVar7 = pbVar3, (ulong)*pbVar3 < 0x2d)) &&
         ((0x100100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
    pbVar3 = pbVar3 + 1;
    pbVar7 = (byte *)end;
  }
  pbVar7 = pbVar7 + (pbVar7 == pbVar9);
  local_50 = (Value *)0x0;
  pbVar3 = pbVar7;
  if (pbVar7 != (byte *)end) {
    pbVar3 = pbVar7 + (*pbVar7 == 0x2d);
  }
  bVar5 = false;
  do {
    bVar2 = *pbVar3;
    if ((((ulong)bVar2 < 0x2d) && ((0x100100000200U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
       ((bVar2 == 0x7d || ((pbVar3 == (byte *)end || (bVar2 == 0x29)))))) {
      if (bVar5) {
        pcVar4 = parseIntegerLiteral((char *)pbVar7,end,&local_50,ddl_int32);
        goto LAB_0066e654;
      }
      break;
    }
    pbVar3 = pbVar3 + 1;
    bVar5 = true;
  } while ((byte)(bVar2 - 0x30) < 10);
  pbVar3 = pbVar7;
  if (pbVar7 != (byte *)end) {
    pbVar3 = pbVar7 + (*pbVar7 == 0x2d);
  }
  bVar5 = false;
  while( true ) {
    bVar2 = *pbVar3;
    if ((((ulong)bVar2 < 0x2d) && ((0x100100000200U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
       (bVar2 == 0x7d)) goto LAB_0066e63f;
    if ((pbVar3 == (byte *)end) || (bVar2 == 0x29)) break;
    if (bVar2 == 0x2e) {
      bVar5 = true;
      goto LAB_0066e5f3;
    }
    if (9 < (byte)(bVar2 - 0x30)) goto LAB_0066e63f;
    pbVar3 = pbVar3 + 1;
    bVar5 = true;
  }
  if (bVar2 == 0x2e) goto LAB_0066e5f3;
  goto LAB_0066e63f;
  while (bVar5 = true, (byte)(bVar2 - 0x30) < 10) {
LAB_0066e5f3:
    pbVar3 = pbVar3 + 1;
    bVar2 = *pbVar3;
    if ((((ulong)bVar2 < 0x2d) && ((0x100100000200U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
       ((bVar2 == 0x7d || ((pbVar3 == (byte *)end || (bVar2 == 0x29)))))) {
      if (bVar5) {
        pcVar4 = parseFloatingLiteral((char *)pbVar7,end,&local_50,ddl_float);
        goto LAB_0066e654;
      }
      break;
    }
  }
LAB_0066e63f:
  if (*pbVar7 == 0x22) {
    pcVar4 = parseStringLiteral((char *)pbVar7,end,&local_50);
LAB_0066e654:
    createPropertyWithData(local_58,local_50,prop);
    return pcVar4;
  }
  local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar9 = (byte *)parseReference((char *)pbVar7,end,&local_48);
  ppNVar1 = local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  names_00 = local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = (Reference *)operator_new(0x10);
    Reference::Reference(this,(long)ppNVar1 - (long)names_00 >> 3,names_00);
    this_00 = (Property *)operator_new(0x20);
    Property::Property(this_00,local_58);
    *prop = this_00;
    this_00->m_ref = this;
  }
  if ((Text *)local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_start == (Text *)0x0) {
    return (char *)pbVar9;
  }
  uVar6 = (long)local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage -
          (long)local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pTVar8 = (Text *)local_48.
                   super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
LAB_0066e56b:
  operator_delete(pTVar8,uVar6);
  return (char *)pbVar9;
}

Assistant:

char *OpenDDLParser::parseProperty( char *in, char *end, Property **prop ) {
    *prop = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    Text *id( ddl_nullptr );
    in = parseIdentifier( in, end, &id );
    if( ddl_nullptr != id ) {
        in = lookForNextToken( in, end );
        if( *in == '=' ) {
            ++in;
            in = getNextToken( in, end );
            Value *primData( ddl_nullptr );
            if( isInteger( in, end ) ) {
                in = parseIntegerLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else if( isFloat( in, end ) ) {
                in = parseFloatingLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else if( isStringLiteral( *in ) ) { // string data
                in = parseStringLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else {                              // reference data
                std::vector<Name*> names;
                in = parseReference( in, end, names );
                if( !names.empty() ) {
                    Reference *ref = new Reference( names.size(), &names[ 0 ] );
                    ( *prop ) = new Property( id );
                    ( *prop )->m_ref = ref;
                }
            }
        } else {
            delete id;
        }
    }

    return in;
}